

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O3

int __thiscall Fl_Table::row_col_clamp(Fl_Table *this,TableContext context,int *R,int *C)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = *R;
  if (iVar3 < 0) {
    *R = 0;
  }
  uVar1 = (uint)(iVar3 < 0);
  iVar3 = *C;
  if (iVar3 < 0) {
    *C = 0;
    uVar1 = 1;
    iVar3 = 0;
  }
  if (context == CONTEXT_ROW_HEADER) {
    iVar2 = this->_cols;
    R = C;
    if (iVar3 != 0 && iVar2 <= iVar3) goto LAB_001cb44c;
  }
  else if (context == CONTEXT_COL_HEADER) {
    iVar2 = this->_rows;
    if (*R != 0 && iVar2 <= *R) {
LAB_001cb44c:
      *R = iVar2 + -1;
      return 1;
    }
  }
  else {
    if (this->_rows <= *R) {
      *R = this->_rows + -1;
      iVar3 = *C;
      uVar1 = 1;
    }
    iVar2 = this->_cols;
    R = C;
    if (iVar2 <= iVar3) goto LAB_001cb44c;
  }
  return uVar1;
}

Assistant:

int Fl_Table::row_col_clamp(TableContext context, int &R, int &C) {
  int clamped = 0;
  if ( R < 0 ) { R = 0; clamped = 1; }
  if ( C < 0 ) { C = 0; clamped = 1; }
  switch ( context ) {
    case CONTEXT_COL_HEADER:
      // Allow col headers to draw even if no rows
      if ( R >= _rows && R != 0 ) { R = _rows - 1; clamped = 1; }
      break;
      
    case CONTEXT_ROW_HEADER:
      // Allow row headers to draw even if no columns
      if ( C >= _cols && C != 0 ) { C = _cols - 1; clamped = 1; }
      break;
      
    case CONTEXT_CELL:
    default:
      // CLAMP R/C TO _rows/_cols
      if ( R >= _rows ) { R = _rows - 1; clamped = 1; }
      if ( C >= _cols ) { C = _cols - 1; clamped = 1; }
      break;
  }
  return(clamped);
}